

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O1

void gatom_bang(t_gatom *x)

{
  _outlet *p_Var1;
  t_pd *pp_Var2;
  uint argc;
  t_atom *ptVar3;
  t_symbol *ptVar4;
  long lVar5;
  char *pcVar6;
  
  ptVar3 = gatom_getatom(x);
  if (x->a_flavor == 2) {
    p_Var1 = (x->a_text).te_outlet;
    if (p_Var1 != (_outlet *)0x0) {
      outlet_symbol(p_Var1,(ptVar3->a_w).w_symbol);
    }
    pcVar6 = x->a_symto->s_name;
    if ((*pcVar6 == '\0') || (pp_Var2 = x->a_expanded_to->s_thing, pp_Var2 == (t_pd *)0x0)) {
      return;
    }
    if (x->a_symto != x->a_symfrom) {
      pd_symbol(pp_Var2,(ptVar3->a_w).w_symbol);
      return;
    }
  }
  else {
    if (x->a_flavor == 1) {
      p_Var1 = (x->a_text).te_outlet;
      if (p_Var1 != (_outlet *)0x0) {
        outlet_float(p_Var1,(ptVar3->a_w).w_float);
      }
      if (*x->a_expanded_to->s_name == '\0') {
        return;
      }
      pp_Var2 = x->a_expanded_to->s_thing;
      if (pp_Var2 == (t_pd *)0x0) {
        return;
      }
      ptVar4 = x->a_symto;
      if (ptVar4 != x->a_symfrom) {
        pd_float(pp_Var2,(ptVar3->a_w).w_float);
        return;
      }
    }
    else {
      argc = binbuf_getnatom((x->a_text).te_binbuf);
      ptVar3 = binbuf_getvec((x->a_text).te_binbuf);
      if (0 < (int)argc) {
        lVar5 = 0;
        do {
          if (1 < *(int *)((long)&ptVar3->a_type + lVar5) - 1U) {
            pd_error(x,"list: only sends literal numbers and symbols");
            return;
          }
          lVar5 = lVar5 + 0x10;
        } while ((ulong)argc << 4 != lVar5);
      }
      p_Var1 = (x->a_text).te_outlet;
      if (p_Var1 != (_outlet *)0x0) {
        outlet_list(p_Var1,&s_list,argc,ptVar3);
      }
      if (*x->a_expanded_to->s_name == '\0') {
        return;
      }
      pp_Var2 = x->a_expanded_to->s_thing;
      if (pp_Var2 == (t_pd *)0x0) {
        return;
      }
      ptVar4 = x->a_symto;
      if (ptVar4 != x->a_symfrom) {
        pd_list(pp_Var2,&s_list,argc,ptVar3);
        return;
      }
    }
    pcVar6 = ptVar4->s_name;
  }
  pd_error(x,"%s: atom with same send/receive name (infinite loop)",pcVar6);
  return;
}

Assistant:

static void gatom_bang(t_gatom *x)
{
    t_atom *ap = gatom_getatom(x);
    if (x->a_flavor == A_FLOAT)
    {
        if (x->a_text.te_outlet)
            outlet_float(x->a_text.te_outlet, ap->a_w.w_float);
        if (*x->a_expanded_to->s_name && x->a_expanded_to->s_thing)
        {
            if (x->a_symto == x->a_symfrom)
                pd_error(x,
                    "%s: atom with same send/receive name (infinite loop)",
                        x->a_symto->s_name);
            else pd_float(x->a_expanded_to->s_thing, ap->a_w.w_float);
        }
    }
    else if (x->a_flavor == A_SYMBOL)
    {
        if (x->a_text.te_outlet)
            outlet_symbol(x->a_text.te_outlet, ap->a_w.w_symbol);
        if (*x->a_symto->s_name && x->a_expanded_to->s_thing)
        {
            if (x->a_symto == x->a_symfrom)
                pd_error(x,
                    "%s: atom with same send/receive name (infinite loop)",
                        x->a_symto->s_name);
            else pd_symbol(x->a_expanded_to->s_thing, ap->a_w.w_symbol);
        }
    }
    else    /* list */
    {
        int argc = binbuf_getnatom(x->a_text.te_binbuf), i;
        t_atom *argv = binbuf_getvec(x->a_text.te_binbuf);
        for (i = 0; i < argc; i++)
            if (argv[i].a_type != A_FLOAT && argv[i].a_type != A_SYMBOL)
        {
            pd_error(x, "list: only sends literal numbers and symbols");
            return;
        }
        if (x->a_text.te_outlet)
            outlet_list(x->a_text.te_outlet, &s_list, argc, argv);
        if (*x->a_expanded_to->s_name && x->a_expanded_to->s_thing)
        {
            if (x->a_symto == x->a_symfrom)
                pd_error(x,
                    "%s: atom with same send/receive name (infinite loop)",
                        x->a_symto->s_name);
            else pd_list(x->a_expanded_to->s_thing, &s_list, argc, argv);
        }
    }
}